

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O2

void __thiscall read_portal_v8::operator()(read_portal_v8 *this,portal_data **_portal,xr_reader *r)

{
  uint16_t *puVar1;
  uint32_t *puVar2;
  portal_data *ppVar3;
  long lVar4;
  
  ppVar3 = (portal_data *)operator_new(0x50);
  (ppVar3->vertices).count = 0;
  *_portal = ppVar3;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  ppVar3->sector_front = *puVar1;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 2);
  ppVar3->sector_back = puVar1[1];
  for (lVar4 = 4; lVar4 != 0x4c; lVar4 = lVar4 + 0xc) {
    xray_re::xr_reader::r_fvector3(r,(fvector3 *)((long)(ppVar3->vertices).array + lVar4 + -4));
  }
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (ppVar3->vertices).count = *puVar2;
  return;
}

Assistant:

void operator()(portal_data*& _portal, xr_reader& r) const {
	portal_data* portal = new portal_data;
	_portal = portal;
	portal->sector_front = r.r_u16();
	portal->sector_back = r.r_u16();
	for (uint_fast32_t i = 0; i != 6; ++i)
		r.r_fvector3(portal->vertices.array[i]);
	portal->vertices.count = r.r_u32();
}